

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

int sqlite_callback(void *data,int num,char **fields,char **columns)

{
  size_type sVar1;
  char *pcVar2;
  ulong uVar3;
  string column;
  variant field;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  void *local_128;
  ulong local_120;
  char **local_118;
  char **local_110;
  variant local_108;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  local_90;
  
  local_c8._M_buckets = &local_c8._M_single_bucket;
  local_c8._M_bucket_count = 1;
  local_c8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8._M_element_count = 0;
  local_c8._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8._M_rehash_policy._M_next_resize = 0;
  local_c8._M_single_bucket = (__node_base_ptr)0x0;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_128 = data;
  local_118 = fields;
  local_110 = columns;
  util::variant::variant(&local_108);
  if (0 < num) {
    uVar3 = 0;
    local_120 = (ulong)(uint)num;
    do {
      sVar1 = local_148._M_string_length;
      pcVar2 = local_110[uVar3];
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "";
      }
      else {
        strlen(pcVar2);
      }
      std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)sVar1,(ulong)pcVar2);
      pcVar2 = local_118[uVar3];
      if (pcVar2 == (char *)0x0) {
        pcVar2 = "";
      }
      util::variant::operator=(&local_108,pcVar2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_util::variant_&,_true>
                (&local_90,&local_148,&local_108);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,util::variant>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.second.val_string._M_dataplus._M_p != &local_90.second.val_string.field_2) {
        operator_delete(local_90.second.val_string._M_dataplus._M_p,
                        local_90.second.val_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
        operator_delete(local_90.first._M_dataplus._M_p,
                        local_90.first.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while (local_120 != uVar3);
  }
  std::
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ::push_back((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               *)((long)local_128 + 0xb0),(value_type *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.val_string._M_dataplus._M_p != &local_108.val_string.field_2) {
    operator_delete(local_108.val_string._M_dataplus._M_p,
                    local_108.val_string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                             local_148.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8);
  return 0;
}

Assistant:

static int sqlite_callback(void *data, int num, char *fields[], char *columns[])
{
	std::unordered_map<std::string, util::variant> result;
	std::string column;
	util::variant field;
	int i;

	for (i = 0; i < num; ++i)
	{
		if (columns[i] == NULL)
		{
			column = "";
		}
		else
		{
			column = columns[i];
		}

		if (fields[i] == NULL)
		{
			field = "";
		}
		else
		{
			field = fields[i];
		}

		result.insert(result.begin(), make_pair(column, field));
	}

	static_cast<Database *>(data)->callbackdata.push_back(result);
	return 0;
}